

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_safe_cond_assign(mbedtls_mpi *X,mbedtls_mpi *Y,uchar assign)

{
  mbedtls_mpi_uint *pmVar1;
  mbedtls_mpi_uint *pmVar2;
  int iVar3;
  mbedtls_mpi *pmVar4;
  ulong uVar5;
  mbedtls_mpi_uint mVar6;
  mbedtls_mpi_uint *pmVar7;
  
  iVar3 = mbedtls_mpi_grow(X,Y->n);
  if (iVar3 == 0) {
    pmVar4 = Y;
    if (assign == '\0') {
      pmVar4 = X;
    }
    X->s = pmVar4->s;
    if (Y->n == 0) {
      uVar5 = 0;
    }
    else {
      pmVar1 = X->p;
      pmVar2 = Y->p;
      uVar5 = 0;
      do {
        pmVar7 = pmVar2 + uVar5;
        if (assign == '\0') {
          pmVar7 = pmVar1 + uVar5;
        }
        pmVar1[uVar5] = *pmVar7;
        uVar5 = uVar5 + 1;
      } while (uVar5 < Y->n);
    }
    if (uVar5 < X->n) {
      pmVar1 = X->p;
      do {
        if (assign == '\0') {
          mVar6 = pmVar1[uVar5];
        }
        else {
          mVar6 = 0;
        }
        pmVar1[uVar5] = mVar6;
        uVar5 = uVar5 + 1;
      } while (uVar5 < X->n);
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_safe_cond_assign( mbedtls_mpi *X, const mbedtls_mpi *Y, unsigned char assign )
{
    int ret = 0;
    size_t i;
    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( Y != NULL );

    /* make sure assign is 0 or 1 in a time-constant manner */
    assign = (assign | (unsigned char)-assign) >> 7;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, Y->n ) );

    X->s = X->s * ( 1 - assign ) + Y->s * assign;

    for( i = 0; i < Y->n; i++ )
        X->p[i] = X->p[i] * ( 1 - assign ) + Y->p[i] * assign;

    for( ; i < X->n; i++ )
        X->p[i] *= ( 1 - assign );

cleanup:
    return( ret );
}